

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  ContentEncoding *pCVar1;
  long lVar2;
  ContentCompression **ppCVar3;
  ContentEncryption **ppCVar4;
  ContentEncryption *this_00;
  unsigned_long_long uVar5;
  longlong lVar6;
  ulong uVar7;
  ContentEncryption *pCVar8;
  long stop;
  ulong uVar9;
  longlong lVar10;
  ulong uVar11;
  longlong pos;
  longlong size_1;
  ContentEncoding *local_50;
  IMkvReader *local_48;
  longlong id;
  long local_38;
  
  stop = size + start;
  uVar11 = 0;
  uVar9 = 0;
  pos = start;
  local_50 = this;
  local_48 = pReader;
  local_38 = start;
  while (pos < stop) {
    lVar2 = ParseElementHeader(local_48,&pos,stop,&id,&size_1);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (id == 0x5035) {
      if (0x7ffffffe < (long)uVar11) {
        return -1;
      }
      uVar11 = uVar11 + 1;
    }
    else if (id == 0x5034) {
      if (0x7ffffffe < (long)uVar9) {
        return -1;
      }
      uVar9 = uVar9 + 1;
    }
    pos = pos + size_1;
    if (stop < pos) {
      return -2;
    }
  }
  if ((long)uVar9 < 1 && (long)uVar11 < 1) {
    return -1;
  }
  if (0 < (long)uVar9) {
    uVar7 = uVar9 * 8;
    if (0x1fffffffffffffff < uVar9) {
      uVar7 = 0xffffffffffffffff;
    }
    ppCVar3 = (ContentCompression **)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    local_50->compression_entries_ = ppCVar3;
    if (ppCVar3 == (ContentCompression **)0x0) {
      return -1;
    }
    local_50->compression_entries_end_ = ppCVar3;
  }
  lVar2 = local_38;
  if (0 < (long)uVar11) {
    uVar9 = uVar11 * 8;
    if (0x1fffffffffffffff < uVar11) {
      uVar9 = 0xffffffffffffffff;
    }
    ppCVar4 = (ContentEncryption **)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
    pCVar1 = local_50;
    local_50->encryption_entries_ = ppCVar4;
    if (ppCVar4 == (ContentEncryption **)0x0) {
      if (local_50->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(local_50->compression_entries_);
      }
      pCVar1->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    local_50->encryption_entries_end_ = ppCVar4;
    lVar2 = local_38;
  }
  do {
    if (stop <= lVar2) {
      return (ulong)(lVar2 == stop) * 2 + -2;
    }
    pos = lVar2;
    lVar2 = ParseElementHeader(local_48,&pos,stop,&id,&size_1);
    lVar10 = size_1;
    lVar6 = pos;
    if (lVar2 < 0) {
      return lVar2;
    }
    switch(id) {
    case 0x5031:
      uVar5 = UnserializeUInt(local_48,pos,size_1);
      local_50->encoding_order_ = uVar5;
      break;
    case 0x5032:
      uVar5 = UnserializeUInt(local_48,pos,size_1);
      local_50->encoding_scope_ = uVar5;
      if (uVar5 == 0) {
        return -1;
      }
      break;
    case 0x5033:
      uVar5 = UnserializeUInt(local_48,pos,size_1);
      local_50->encoding_type_ = uVar5;
      break;
    case 0x5034:
      this_00 = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      if (this_00 == (ContentEncryption *)0x0) {
        return -1;
      }
      pCVar8 = this_00;
      ContentCompression::ContentCompression((ContentCompression *)this_00);
      lVar10 = size_1;
      lVar6 = pos;
      lVar2 = ParseCompressionEntry
                        ((ContentEncoding *)pCVar8,pos,size_1,local_48,(ContentCompression *)this_00
                        );
      if (lVar2 != 0) {
        ContentCompression::~ContentCompression((ContentCompression *)this_00);
LAB_00159a67:
        operator_delete(this_00);
        return lVar2;
      }
      ppCVar4 = (ContentEncryption **)local_50->compression_entries_end_;
      local_50->compression_entries_end_ = (ContentCompression **)(ppCVar4 + 1);
      goto LAB_001599bb;
    case 0x5035:
      this_00 = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      if (this_00 == (ContentEncryption *)0x0) {
        return -1;
      }
      pCVar8 = this_00;
      ContentEncryption::ContentEncryption(this_00);
      lVar10 = size_1;
      lVar6 = pos;
      lVar2 = ParseEncryptionEntry((ContentEncoding *)pCVar8,pos,size_1,local_48,this_00);
      if (lVar2 != 0) {
        ContentEncryption::~ContentEncryption(this_00);
        goto LAB_00159a67;
      }
      ppCVar4 = local_50->encryption_entries_end_;
      local_50->encryption_entries_end_ = ppCVar4 + 1;
LAB_001599bb:
      *ppCVar4 = this_00;
    }
    lVar2 = lVar6 + lVar10;
    if (stop < lVar6 + lVar10) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}